

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

void google::protobuf::compiler::cpp::ListAllTypesForServices
               (FileDescriptor *fd,
               vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
               *types)

{
  ServiceDescriptor *this;
  MethodDescriptor *this_00;
  int i;
  int index;
  int j;
  int index_00;
  Descriptor *local_40;
  FileDescriptor *local_38;
  
  local_38 = fd;
  for (index = 0; index < local_38->service_count_; index = index + 1) {
    this = FileDescriptor::service(local_38,index);
    for (index_00 = 0; index_00 < this->method_count_; index_00 = index_00 + 1) {
      this_00 = ServiceDescriptor::method(this,index_00);
      local_40 = MethodDescriptor::input_type(this_00);
      std::
      vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
      ::emplace_back<google::protobuf::Descriptor_const*>
                ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
                  *)types,&local_40);
      local_40 = MethodDescriptor::output_type(this_00);
      std::
      vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
      ::emplace_back<google::protobuf::Descriptor_const*>
                ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
                  *)types,&local_40);
    }
  }
  return;
}

Assistant:

void ListAllTypesForServices(const FileDescriptor* fd,
                             std::vector<const Descriptor*>* types) {
  for (int i = 0; i < fd->service_count(); i++) {
    const ServiceDescriptor* sd = fd->service(i);
    for (int j = 0; j < sd->method_count(); j++) {
      const MethodDescriptor* method = sd->method(j);
      types->push_back(method->input_type());
      types->push_back(method->output_type());
    }
  }
}